

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialNormalizer.cpp
# Opt level: O0

NormalizationResult *
Kernel::normalizeNumSort<Kernel::NumTraits<Kernel::RationalConstantType>>
          (TermList t,NormalizationResult *ts,bool *simplified)

{
  anon_class_16_2_400f5052 func;
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_PolynomialNormalizer_cpp:339:19),_Kernel::PolyNf>_>
  it;
  bool bVar1;
  undefined1 uVar2;
  uint uVar3;
  uint uVar4;
  Interpretation IVar5;
  bool *in_RDX;
  TermList in_RSI;
  NormalizationResult *in_RDI;
  FuncId FVar6;
  Option<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  out;
  NormalizationResult rhs;
  FuncId fn;
  Option<const_Kernel::RationalConstantType_&> n;
  Option<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  res;
  Term *term;
  anon_class_1_0_00000001 singletonProduct;
  Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
  *in_stack_fffffffffffffd58;
  Term *in_stack_fffffffffffffd60;
  Variable t_00;
  undefined4 in_stack_fffffffffffffd68;
  Interpretation in_stack_fffffffffffffd6c;
  undefined4 uVar7;
  RationalConstantType *in_stack_fffffffffffffd70;
  Interpretation in_stack_fffffffffffffd8c;
  Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
  **in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  undefined8 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  RationalConstantType *c;
  undefined7 in_stack_fffffffffffffdd0;
  NormalizationResult *t_01;
  anon_class_1_0_00000001 *in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdf0 [16];
  undefined1 local_1f8 [24];
  PolyNf *pPStack_1e0;
  undefined8 local_1b8;
  TermList *pTStack_1b0;
  OptionBase<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  local_144;
  NormalizationResult *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff2c;
  RationalConstantType local_80;
  Term *local_48;
  Variable local_40 [10];
  NormalizationResult *lhs;
  
  t_01 = in_RDI;
  lhs = in_RDI;
  bVar1 = TermList::isVar((TermList *)in_stack_fffffffffffffd60);
  if (bVar1) {
    uVar3 = TermList::var((TermList *)&stack0xfffffffffffffff0);
    t_00._num = (uint)((ulong)in_stack_fffffffffffffd60 >> 0x20);
    Variable::Variable(local_40,uVar3);
    PolyNf::PolyNf((PolyNf *)in_stack_fffffffffffffd58,t_00);
    normalizeNumSort<Kernel::NumTraits<Kernel::RationalConstantType>_>::anon_class_1_0_00000001::
    operator()(in_stack_fffffffffffffde8,(PolyNf *)t_01);
    return t_01;
  }
  local_48 = TermList::term((TermList *)0x92250c);
  c = &local_80;
  func.simplified._0_4_ = in_stack_fffffffffffffda8;
  func.ts = (NormalizationResult **)in_stack_fffffffffffffda0;
  func.simplified._4_4_ = in_stack_fffffffffffffdac;
  NumTraits<Kernel::RationalConstantType>::
  ifLinMul<Kernel::normalizeNumSort<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::TermList,Lib::Coproduct<Kernel::PolyNf,Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>*,bool&)::_lambda(auto:1&,auto:2)_1_>
            ((Term *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),func);
  uVar2 = Lib::Option::operator_cast_to_bool
                    ((Option<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                      *)0x922568);
  if ((bool)uVar2) {
    Lib::
    Option<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ::operator*((Option<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                 *)0x922585);
    Lib::
    Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
    ::Coproduct((Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                 *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
    goto LAB_00922a58;
  }
  NumTraits<Kernel::RationalConstantType>::tryNumeral
            ((Term *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  bVar1 = Lib::Option::operator_cast_to_bool
                    ((Option<const_Kernel::RationalConstantType_&> *)0x9225ed);
  if (bVar1) {
    Lib::Option<const_Kernel::RationalConstantType_&>::operator*
              ((Option<const_Kernel::RationalConstantType_&> *)0x92260d);
    RationalConstantType::RationalConstantType
              (in_stack_fffffffffffffd70,
               (RationalConstantType *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68)
              );
    wrapNumeral<Kernel::RationalConstantType>(c);
    RationalConstantType::~RationalConstantType((RationalConstantType *)in_stack_fffffffffffffd60);
    goto LAB_00922a58;
  }
  FVar6 = FuncId::symbolOf(in_stack_fffffffffffffd60);
  uVar4 = FVar6._num;
  uVar3 = uVar4;
  bVar1 = FuncId::isInterpreted((FuncId *)0x9226bf);
  if (bVar1) {
    IVar5 = FuncId::interpretation((FuncId *)0x9226df);
    in_stack_fffffffffffffd90 =
         (Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
          **)(ulong)(IVar5 - RAT_UNARY_MINUS);
    switch(in_stack_fffffffffffffd90) {
    case (Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
          **)0x0:
      normalizeMinus<Kernel::NumTraits<Kernel::RationalConstantType>>
                (in_RDI,(bool *)CONCAT17(uVar2,in_stack_fffffffffffffdd0));
      break;
    case (Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
          **)0x1:
      normalizeAdd<Kernel::NumTraits<Kernel::RationalConstantType>>
                ((NormalizationResult *)CONCAT44(in_stack_ffffffffffffff2c,uVar3),
                 in_stack_ffffffffffffff20);
      break;
    case (Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
          **)0x2:
      normalizeMinus<Kernel::NumTraits<Kernel::RationalConstantType>>
                (in_RDI,(bool *)CONCAT17(uVar2,in_stack_fffffffffffffdd0));
      normalizeAdd<Kernel::NumTraits<Kernel::RationalConstantType>>
                ((NormalizationResult *)CONCAT44(in_stack_ffffffffffffff2c,uVar3),
                 in_stack_ffffffffffffff20);
      Lib::
      Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
      ::~Coproduct((Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                    *)0x9227cf);
      break;
    case (Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
          **)0x3:
      normalizeMul<Kernel::NumTraits<Kernel::RationalConstantType>>
                (lhs,(NormalizationResult *)in_RSI._content,in_RDX);
      break;
    default:
      in_stack_fffffffffffffd8c = FuncId::interpretation((FuncId *)0x922836);
      normalizeSpecialized<Kernel::NumTraits<Kernel::RationalConstantType>>
                (in_stack_fffffffffffffd6c,(NormalizationResult *)in_stack_fffffffffffffd60,
                 (bool *)in_stack_fffffffffffffd58);
      bVar1 = Lib::
              OptionBase<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
              ::isSome(&local_144);
      if (bVar1) {
        Lib::
        OptionBase<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
        ::unwrap((OptionBase<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                  *)0x92287f);
        Lib::
        Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
        ::Coproduct((Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                     *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
      }
      Lib::
      Option<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      ::~Option((Option<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                 *)0x9228e5);
      if (bVar1) break;
      goto LAB_009228fa;
    }
  }
  else {
LAB_009228fa:
    local_1b8 = CONCAT44(in_stack_ffffffffffffff2c,uVar3);
    pTStack_1b0 = FVar6._typeArgs;
    FuncId::numTermArguments((FuncId *)0x922917);
    Lib::
    arrayIter<Lib::Coproduct<Kernel::PolyNf,Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>*,unsigned_int>
              (in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c);
    Lib::
    IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Lib::Coproduct<Kernel::PolyNf,Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>*,unsigned_int>(Lib::Coproduct<Kernel::PolyNf,Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>*&,unsigned_int)::{lambda(auto:1)#1},Lib::Coproduct<Kernel::PolyNf,Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>&>>
    ::
    map<Kernel::normalizeNumSort<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::TermList,Lib::Coproduct<Kernel::PolyNf,Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>*,bool&)::_lambda(Lib::Coproduct<Kernel::PolyNf,Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>&)_1_>
              ((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_&>_>
                *)local_1f8,&stack0xfffffffffffffdf0);
    uVar3 = (uint)local_1f8._16_8_;
    uVar7 = SUB84(local_1f8._16_8_,4);
    it._iter._inner._func.a =
         (Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
          **)in_stack_fffffffffffffde8;
    it._iter._0_8_ = t_01;
    it._iter._inner._8_16_ = in_stack_fffffffffffffdf0;
    Lib::Stack<Kernel::PolyNf>::
    fromIterator<Lib::IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Lib::Coproduct<Kernel::PolyNf,Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>*,unsigned_int>(Lib::Coproduct<Kernel::PolyNf,Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>*&,unsigned_int)::_lambda(auto:1)_1_,Li___ConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>&)_1_,Kernel::PolyNf>>>
              (it);
    FVar6._4_4_ = uVar7;
    FVar6._num = uVar3;
    FVar6._typeArgs = (TermList *)pPStack_1e0;
    FuncTerm::FuncTerm((FuncTerm *)local_1f8._8_8_,FVar6,(Stack<Kernel::PolyNf> *)local_1f8._0_8_);
    Lib::perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>
              ((FuncTerm *)CONCAT44(uVar4,in_stack_fffffffffffffda8));
    PolyNf::PolyNf(pPStack_1e0,
                   (Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison> *)CONCAT44(uVar7,uVar3));
    normalizeNumSort<Kernel::NumTraits<Kernel::RationalConstantType>_>::anon_class_1_0_00000001::
    operator()(in_stack_fffffffffffffde8,(PolyNf *)t_01);
    FuncTerm::~FuncTerm((FuncTerm *)0x9229f8);
    Lib::Stack<Kernel::PolyNf>::~Stack((Stack<Kernel::PolyNf> *)local_1f8._8_8_);
  }
LAB_00922a58:
  Lib::
  Option<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  ::~Option((Option<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
             *)0x922a65);
  return t_01;
}

Assistant:

NormalizationResult normalizeNumSort(TermList t, NormalizationResult* ts, bool& simplified)
{
  using Polynom      = Polynom<NumTraits>;
  using PreMonom     = PreMonom    <NumTraits>;

  auto singletonProduct = [](PolyNf t) -> NormalizationResult {
    return NormalizationResult(PreMonom({t}));
  };

  if (t.isVar()) {
    return singletonProduct(PolyNf(Variable(t.var())));

  } else {
    auto term = t.term();
    auto res = NumTraits::ifLinMul(term, [&](auto& n, auto t) -> NormalizationResult {
        auto& inner = ts[0];
        ASS(inner.is<Polynom>() || inner.is<PreMonom>())
        if (inner.is<Polynom>()) {
          return NormalizationResult(
              PreMonom(n, {RenderPolyNf{}(std::move(*inner.template as<Polynom>()))}));
        } else {
          if (inner.as<PreMonom>()->numeral != 1 && n != 1) {
            simplified = true;
          }
          inner.as<PreMonom>()->numeral *= n;
          return std::move(inner);
        }
    });
    if (res) return std::move(*res);
    if (auto n = NumTraits::tryNumeral(term)) {
      return wrapNumeral(*n);
    }
    auto fn = FuncId::symbolOf(term);
    if (fn.isInterpreted()) {
      switch(fn.interpretation()) {
        case NumTraits::mulI:
          ASS(ts != nullptr);
          return normalizeMul<NumTraits>(ts[0], ts[1], simplified);
        case NumTraits::addI:
          ASS(ts != nullptr);
          return normalizeAdd<NumTraits>(ts[0], ts[1]);
        case NumTraits::binMinusI:{
          ASS(ts != nullptr);
          auto rhs = normalizeMinus<NumTraits>(ts[1], simplified);
          return normalizeAdd<NumTraits>(ts[0], rhs);
        }
        case NumTraits::minusI:
          ASS(ts != nullptr);
          return normalizeMinus<NumTraits>(ts[0], simplified);
        default:
        {
          auto out = normalizeSpecialized<NumTraits>(fn.interpretation(), ts, simplified);
          if (out.isSome()) {
            return std::move(out.unwrap());
          }
        }
      }
    }

    return singletonProduct(PolyNf(perfect(FuncTerm(
        fn, 
        Stack<PolyNf>::fromIterator(
            arrayIter(ts, fn.numTermArguments())
            .map( [](NormalizationResult& r) -> PolyNf { return std::move(r).apply(RenderPolyNf{}); }))
      )
    )));
  }
}